

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

int mpt_bitmap_set(uint8_t *base,size_t len,long pos)

{
  ulong uVar1;
  byte bVar2;
  size_t off;
  long pos_local;
  size_t len_local;
  uint8_t *base_local;
  
  if ((pos < 0) || (uVar1 = pos / 8, len <= uVar1)) {
    base_local._4_4_ = -0x11;
  }
  else {
    bVar2 = (byte)(pos % 8);
    if (((uint)base[uVar1] & 1 << (bVar2 & 0x1f)) == 0) {
      base[uVar1] = base[uVar1] | (byte)(1 << (bVar2 & 0x1f));
      base_local._4_4_ = 1;
    }
    else {
      base_local._4_4_ = 0;
    }
  }
  return base_local._4_4_;
}

Assistant:

extern int mpt_bitmap_set(uint8_t *base, size_t len, long pos)
{
	size_t off;
	
	if (pos < 0 || (off = pos / 8) >= len) {
		return MPT_ERROR(MissingBuffer);
	}
	pos = pos % 8;
	
	if (base[off] & 1<<pos) return 0;
	base[off] |= 1<<pos;
	
	return 1;
}